

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O2

vector<FBX::Node,_std::allocator<FBX::Node>_> *
FBX::findNodes(vector<FBX::Node,_std::allocator<FBX::Node>_> *__return_storage_ptr__,Node *node,
              string *nodeId)

{
  pointer pNVar1;
  __type _Var2;
  Node *e;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (node->children).super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pNVar1; __x = __x + 1) {
    _Var2 = std::operator==(&__x->id,nodeId);
    if (_Var2) {
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Node> findNodes(const Node &node, const std::string &nodeId) {
        std::vector<Node> nodes;

        for (const Node &e : node.children)
            if (e.id == nodeId)
                nodes.push_back(e);
        return nodes;
    }